

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesStandbyGetProperties(zes_standby_handle_t hStandby,zes_standby_properties_t *pProperties)

{
  zes_pfnStandbyGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  zes_standby_properties_t *pProperties_local;
  zes_standby_handle_t hStandby_local;
  
  if (*(code **)(*(long *)(hStandby + 8) + 0xb78) == (code *)0x0) {
    hStandby_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hStandby_local._4_4_ =
         (**(code **)(*(long *)(hStandby + 8) + 0xb78))(*(undefined8 *)hStandby,pProperties);
  }
  return hStandby_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesStandbyGetProperties(
        zes_standby_handle_t hStandby,                  ///< [in] Handle for the component.
        zes_standby_properties_t* pProperties           ///< [in,out] Will contain the standby hardware properties.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_standby_object_t*>( hStandby )->dditable;
        auto pfnGetProperties = dditable->zes.Standby.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hStandby = reinterpret_cast<zes_standby_object_t*>( hStandby )->handle;

        // forward to device-driver
        result = pfnGetProperties( hStandby, pProperties );

        return result;
    }